

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O0

void __thiscall
UnixMakefileGenerator::writeSubTargets
          (UnixMakefileGenerator *this,QTextStream *t,QList<MakefileGenerator::SubTarget_*> *targets
          ,int flags)

{
  SubTarget *pSVar1;
  undefined8 uVar2;
  bool bVar3;
  QString *out_directory_00;
  qsizetype qVar4;
  const_reference ppSVar5;
  QTextStream *pQVar6;
  MakefileGenerator *this_00;
  long lVar7;
  ulong uVar8;
  QList<MakefileGenerator::SubTarget_*> *in_RDX;
  MakefileGenerator *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  SubTarget *subtarget_1;
  int target_1;
  SubTarget *subtarget;
  int target;
  QString in;
  QString out;
  FileFixifyTypes in_stack_0000013c;
  QString makefilein;
  QString out_directory_cdin;
  QString dist_directory;
  QString out_directory;
  QString in_directory;
  QString abs_source_path;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
  *in_stack_fffffffffffffbd8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
  *in_stack_fffffffffffffbe0;
  QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>
  *in_stack_fffffffffffffbe8;
  ProKey *in_stack_fffffffffffffbf0;
  QMakeEvaluator *in_stack_fffffffffffffbf8;
  QString *out_00;
  QList<MakefileGenerator::SubTarget_*> *this_01;
  MakefileGenerator *this_02;
  int local_3ac;
  int local_3a0;
  undefined1 local_380 [7];
  undefined1 in_stack_fffffffffffffc87;
  QString *in_stack_fffffffffffffc88;
  MakefileGenerator *in_stack_fffffffffffffc90;
  undefined1 local_338 [24];
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined1 local_2f0 [24];
  undefined1 local_2d8 [160];
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
  local_238;
  undefined1 local_1c0 [24];
  qsizetype local_1a8;
  char (*local_1a0) [28];
  Data *local_198;
  undefined1 local_190 [64];
  QString *in_stack_fffffffffffffeb0;
  QString *in_stack_fffffffffffffeb8;
  undefined1 local_140 [4];
  QList<MakefileGenerator::SubTarget_*> *in_stack_fffffffffffffec8;
  QTextStream *in_stack_fffffffffffffed0;
  MakefileGenerator *in_stack_fffffffffffffed8;
  QString local_b0 [3];
  undefined1 local_68 [48];
  undefined1 local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDX;
  this_02 = in_RSI;
  QList<MakefileGenerator::SubTarget_*>::QList
            ((QList<MakefileGenerator::SubTarget_*> *)in_stack_fffffffffffffbe0,
             (QList<MakefileGenerator::SubTarget_*> *)in_stack_fffffffffffffbd8);
  uVar2 = _local_140;
  uVar8 = (ulong)_local_140 >> 0x20;
  MakefileGenerator::writeSubTargets
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (int)uVar8);
  _local_140 = uVar2;
  QList<MakefileGenerator::SubTarget_*>::~QList((QList<MakefileGenerator::SubTarget_*> *)0x219cff);
  QTextStream::operator<<((QTextStream *)in_RSI,"dist: distdir FORCE");
  ::operator<<((QTextStream *)in_stack_fffffffffffffbe0,
               (QTextStreamFunction)in_stack_fffffffffffffbd8);
  QTextStream::operator<<
            ((QTextStream *)in_RSI,
             "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar) && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)"
            );
  ::operator<<((QTextStream *)in_stack_fffffffffffffbe0,
               (QTextStreamFunction)in_stack_fffffffffffffbd8);
  ::operator<<((QTextStream *)in_stack_fffffffffffffbe0,
               (QTextStreamFunction)in_stack_fffffffffffffbd8);
  QTextStream::operator<<((QTextStream *)in_RSI,"distdir:");
  local_3a0 = 0;
  while( true ) {
    out_directory_00 = (QString *)(long)local_3a0;
    qVar4 = QList<MakefileGenerator::SubTarget_*>::size(this_01);
    if (qVar4 <= (long)out_directory_00) break;
    ppSVar5 = QList<MakefileGenerator::SubTarget_*>::at
                        ((QList<MakefileGenerator::SubTarget_*> *)in_stack_fffffffffffffbe0,
                         (qsizetype)in_stack_fffffffffffffbd8);
    pSVar1 = *ppSVar5;
    pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)in_RSI," ");
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)&pSVar1->target);
    QTextStream::operator<<(pQVar6,"-distdir");
    local_3a0 = local_3a0 + 1;
  }
  this_00 = (MakefileGenerator *)QTextStream::operator<<((QTextStream *)in_RSI," FORCE\n\t");
  QString::QString((QString *)in_stack_fffffffffffffbe8,(char *)out_directory_00);
  MakefileGenerator::mkdir_p_asstring
            (this_00,(QString *)in_stack_fffffffffffffbf8,
             SUB81((ulong)in_stack_fffffffffffffbf0 >> 0x38,0));
  pQVar6 = (QTextStream *)QTextStream::operator<<((QTextStream *)this_00,(QString *)local_38);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"\n\t");
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"$(COPY_FILE) --parents ");
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8);
  MakefileGenerator::fileVar
            ((MakefileGenerator *)in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,(QString *)local_68);
  pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," $(DISTDIR)");
  QTextStream::operator<<(pQVar6,(QString *)&Option::dir_sep);
  ::operator<<((QTextStream *)in_stack_fffffffffffffbe0,
               (QTextStreamFunction)in_stack_fffffffffffffbd8);
  ::operator<<((QTextStream *)in_stack_fffffffffffffbe0,
               (QTextStreamFunction)in_stack_fffffffffffffbd8);
  QString::~QString((QString *)0x219f0d);
  ProKey::~ProKey((ProKey *)0x219f1a);
  QString::~QString((QString *)0x219f27);
  QString::~QString((QString *)0x219f34);
  local_b0[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_b0[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_b0[0].d.size = -0x5555555555555556;
  out_00 = *(QString **)(in_RDI + 0xd8);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffbe0,(char *)in_stack_fffffffffffffbd8);
  QMakeEvaluator::first(in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  ProString::toQString((ProString *)in_stack_fffffffffffffbd8);
  ProString::~ProString((ProString *)0x219fc2);
  ProKey::~ProKey((ProKey *)0x219fcf);
  local_3ac = 0;
  while( true ) {
    lVar7 = (long)local_3ac;
    qVar4 = QList<MakefileGenerator::SubTarget_*>::size(this_01);
    if (qVar4 <= lVar7) break;
    ppSVar5 = QList<MakefileGenerator::SubTarget_*>::at
                        ((QList<MakefileGenerator::SubTarget_*> *)in_stack_fffffffffffffbe0,
                         (qsizetype)in_stack_fffffffffffffbd8);
    pSVar1 = *ppSVar5;
    QString::QString((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
    bVar3 = QString::isEmpty((QString *)0x21a063);
    if ((!bVar3) &&
       (uVar8 = QString::endsWith((QString *)&stack0xfffffffffffffed8,0x3bdbd8), (uVar8 & 1) == 0))
    {
      QString::operator+=((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8)
      ;
    }
    _local_140 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
    bVar3 = QString::isEmpty((QString *)0x21a0e8);
    if ((!bVar3) && (uVar8 = QString::endsWith((QString *)local_140,0x3bdbd8), (uVar8 & 1) == 0)) {
      QString::operator+=((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8)
      ;
    }
    bVar3 = QString::isEmpty((QString *)0x21a12a);
    if ((!bVar3) &&
       (uVar8 = QString::startsWith((QString *)local_140,(CaseSensitivity)local_b0),
       (uVar8 & 1) != 0)) {
      QString::size(local_b0);
      QString::mid((longlong)local_190,(longlong)local_140);
      ::operator+((QString *)in_stack_fffffffffffffbe8,(QString *)in_stack_fffffffffffffbe0);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QString_&,_QString> *)in_stack_fffffffffffffbd8);
      QString::operator=((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
      QString::~QString((QString *)0x21a1d4);
      QStringBuilder<QString_&,_QString>::~QStringBuilder
                ((QStringBuilder<QString_&,_QString> *)0x21a1e1);
      QString::~QString((QString *)0x21a1ee);
    }
    local_1a8 = -0x5555555555555556;
    local_1a0 = (char (*) [28])0xaaaaaaaaaaaaaaaa;
    local_198 = (Data *)0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
    uVar8 = QString::endsWith((QString *)&local_1a8,0x3bdbd8);
    if ((uVar8 & 1) != 0) {
      QString::size(&Option::dir_sep);
      QString::chop((longlong)&local_1a8);
    }
    uVar8 = QString::startsWith((QString *)&local_1a8,0x3bdbd8);
    if ((uVar8 & 1) == 0) {
      QString::prepend((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
    }
    local_1c0._0_8_ = (char (*) [8])0xaaaaaaaaaaaaaaaa;
    local_1c0._8_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1c0._16_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
    bVar3 = QString::isEmpty((QString *)0x21a2d6);
    if (bVar3) {
      QString::QString((QString *)in_stack_fffffffffffffbe8,(char *)out_directory_00);
    }
    else {
      (**(code **)(*(long *)in_RDI + 0x60))(&local_238.a.a.b.d.size,in_RDI,local_140);
      ::operator+((char (*) [6])in_stack_fffffffffffffbe8,(QString *)in_stack_fffffffffffffbe0);
      ::operator+((QStringBuilder<const_char_(&)[6],_QString> *)in_stack_fffffffffffffbe8,
                  (char (*) [5])in_stack_fffffffffffffbe0);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]> *)
                 in_stack_fffffffffffffbd8);
      QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<const_char_(&)[6],_QString>,_const_char_(&)[5]> *)
                 0x21a38e);
      QStringBuilder<const_char_(&)[6],_QString>::~QStringBuilder
                ((QStringBuilder<const_char_(&)[6],_QString> *)0x21a3a4);
      QString::~QString((QString *)0x21a3ba);
    }
    local_238.a.a.a = (char (*) [8])0xaaaaaaaaaaaaaaaa;
    local_238.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_238.a.a.b.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (**(code **)(*(long *)in_RDI + 0x60))(local_2d8,in_RDI,&pSVar1->makefile);
    ::operator+((char (*) [8])in_stack_fffffffffffffbe8,(QString *)in_stack_fffffffffffffbe0);
    ::operator+(&in_stack_fffffffffffffbe8->a,(char (*) [28])in_stack_fffffffffffffbe0);
    (**(code **)(*(long *)in_RDI + 0x60))(local_2f0,in_RDI,&local_1a8);
    ::operator+(in_stack_fffffffffffffbe8,(QString *)in_stack_fffffffffffffbe0);
    ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffbd8);
    QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
    ::~QStringBuilder(in_stack_fffffffffffffbe0);
    QString::~QString((QString *)0x21a4a2);
    QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]> *)
               0x21a4af);
    QStringBuilder<const_char_(&)[8],_QString>::~QStringBuilder
              ((QStringBuilder<const_char_(&)[8],_QString> *)0x21a4bc);
    QString::~QString((QString *)0x21a4c9);
    local_308 = 0xaaaaaaaaaaaaaaaa;
    local_300 = 0xaaaaaaaaaaaaaaaa;
    local_2f8 = 0xaaaaaaaaaaaaaaaa;
    QString::QString((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
    local_320 = 0xaaaaaaaaaaaaaaaa;
    local_318 = 0xaaaaaaaaaaaaaaaa;
    local_310 = 0xaaaaaaaaaaaaaaaa;
    ::operator+((QString *)in_stack_fffffffffffffbe0,(QString *)in_stack_fffffffffffffbd8);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffffbd8);
    QFlags<MakefileGenerator::FileFixifyType>::QFlags
              ((QFlags<MakefileGenerator::FileFixifyType> *)in_stack_fffffffffffffbe0,
               (FileFixifyType)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
    MakefileGenerator::fileFixify
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_0000013c,
               (bool)in_stack_fffffffffffffc87);
    (**(code **)(*(long *)in_RDI + 0x60))(&local_320,in_RDI,local_338);
    QString::~QString((QString *)0x21a5d5);
    QString::~QString((QString *)0x21a5e2);
    uVar8 = QString::startsWith((QString *)&local_308,(CaseSensitivity)&stack0xfffffffffffffed8);
    if ((uVar8 & 1) != 0) {
      QString::size((QString *)&stack0xfffffffffffffed8);
      QString::remove((longlong)&local_308,0);
    }
    pQVar6 = (QTextStream *)
             QTextStream::operator<<((QTextStream *)in_RSI,(QString *)&pSVar1->target);
    QTextStream::operator<<(pQVar6,"-distdir: FORCE");
    (**(code **)(*(long *)in_RDI + 0x60))(local_380,in_RDI,&local_308);
    in_stack_fffffffffffffbd8 =
         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_QString>,_const_char_(&)[28]>,_QString>
          *)local_1c0;
    in_stack_fffffffffffffbe0 = &local_238;
    MakefileGenerator::writeSubTargetCall
              (this_02,in_RDI,(QString *)this_01,(QString *)in_RDX,out_directory_00,out_00,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffeb8);
    QString::~QString((QString *)0x21a6c5);
    ::operator<<((QTextStream *)in_stack_fffffffffffffbe0,
                 (QTextStreamFunction)in_stack_fffffffffffffbd8);
    QString::~QString((QString *)0x21a6e6);
    QString::~QString((QString *)0x21a6f3);
    QString::~QString((QString *)0x21a700);
    QString::~QString((QString *)0x21a70d);
    QString::~QString((QString *)0x21a71a);
    QString::~QString((QString *)0x21a727);
    QString::~QString((QString *)0x21a734);
    local_3ac = local_3ac + 1;
  }
  QString::~QString((QString *)0x21a751);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::writeSubTargets(QTextStream &t, QList<MakefileGenerator::SubTarget*> targets, int flags)
{
    MakefileGenerator::writeSubTargets(t, targets, flags);

    t << "dist: distdir FORCE" << Qt::endl;
    t << "\t(cd `dirname $(DISTDIR)` && $(TAR) $(DISTNAME).tar $(DISTNAME) && $(COMPRESS) $(DISTNAME).tar)"
         " && $(MOVE) `dirname $(DISTDIR)`/$(DISTNAME).tar.gz . && $(DEL_FILE) -r $(DISTDIR)";
    t << Qt::endl << Qt::endl;

    t << "distdir:";
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        t << " " << subtarget->target << "-distdir";
    }
    t << " FORCE\n\t"
      << mkdir_p_asstring("$(DISTDIR)", false) << "\n\t"
      << "$(COPY_FILE) --parents " << fileVar("DISTFILES") << " $(DISTDIR)" << Option::dir_sep << Qt::endl << Qt::endl;

    const QString abs_source_path = project->first("QMAKE_ABSOLUTE_SOURCE_PATH").toQString();
    for (int target = 0; target < targets.size(); ++target) {
        SubTarget *subtarget = targets.at(target);
        QString in_directory = subtarget->in_directory;
        if (!in_directory.isEmpty() && !in_directory.endsWith(Option::dir_sep))
            in_directory += Option::dir_sep;
        QString out_directory = subtarget->out_directory;
        if (!out_directory.isEmpty() && !out_directory.endsWith(Option::dir_sep))
            out_directory += Option::dir_sep;
        if (!abs_source_path.isEmpty() && out_directory.startsWith(abs_source_path))
            out_directory = Option::output_dir + out_directory.mid(abs_source_path.size());

        QString dist_directory = out_directory;
        if (dist_directory.endsWith(Option::dir_sep))
            dist_directory.chop(Option::dir_sep.size());
        if (!dist_directory.startsWith(Option::dir_sep))
            dist_directory.prepend(Option::dir_sep);

        QString out_directory_cdin = out_directory.isEmpty() ? QString("\n\t")
                                                             : "\n\tcd " + escapeFilePath(out_directory) + " && ";
        QString makefilein = " -e -f " + escapeFilePath(subtarget->makefile)
                + " distdir DISTDIR=$(DISTDIR)" + escapeFilePath(dist_directory);

        QString out = subtarget->makefile;
        QString in = escapeFilePath(fileFixify(in_directory + subtarget->profile, FileFixifyAbsolute));
        if (out.startsWith(in_directory))
            out.remove(0, in_directory.size());

        t << subtarget->target << "-distdir: FORCE";
        writeSubTargetCall(t, in_directory, in, out_directory, escapeFilePath(out),
                           out_directory_cdin, makefilein);
        t << Qt::endl;
    }
}